

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

Bucket __thiscall
QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QByteArray>_>::findBucketWithHash<QByteArray>
          (Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *this,QByteArray *key,size_t hash)

{
  byte bVar1;
  bool bVar2;
  Span *pSVar3;
  ulong uVar4;
  Bucket BVar5;
  
  uVar4 = this->numBuckets - 1 & hash;
  pSVar3 = this->spans + (uVar4 >> 7);
  uVar4 = (ulong)((uint)uVar4 & 0x7f);
  bVar1 = pSVar3->offsets[uVar4];
  while ((bVar1 != 0xff &&
         (bVar2 = operator==((QByteArray *)((pSVar3->entries->storage).data + (uint)bVar1 * 0x30),
                             key), !bVar2))) {
    uVar4 = uVar4 + 1;
    if (uVar4 == 0x80) {
      pSVar3 = pSVar3 + 1;
      if (((long)pSVar3 - (long)this->spans >> 4) * -0x71c71c71c71c71c7 - (this->numBuckets >> 7) ==
          0) {
        pSVar3 = this->spans;
      }
      uVar4 = 0;
    }
    bVar1 = pSVar3->offsets[uVar4];
  }
  BVar5.index = uVar4;
  BVar5.span = pSVar3;
  return BVar5;
}

Assistant:

Bucket findBucketWithHash(const K &key, size_t hash) const noexcept
    {
        static_assert(std::is_same_v<std::remove_cv_t<Key>, K> ||
                QHashHeterogeneousSearch<std::remove_cv_t<Key>, K>::value);
        Q_ASSERT(numBuckets > 0);
        Bucket bucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
        // loop over the buckets until we find the entry we search for
        // or an empty slot, in which case we know the entry doesn't exist
        while (true) {
            size_t offset = bucket.offset();
            if (offset == SpanConstants::UnusedEntry) {
                return bucket;
            } else {
                Node &n = bucket.nodeAtOffset(offset);
                if (qHashEquals(n.key, key))
                    return bucket;
            }
            bucket.advanceWrapped(this);
        }
    }